

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::DecimalQuantity::convertToAccurateDouble(DecimalQuantity *this)

{
  int iVar1;
  bool sign;
  int32_t point;
  int32_t length;
  char buffer [18];
  
  iVar1 = this->origDelta;
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (this->origDouble,SHORTEST,0,buffer,0x12,&sign,&length,&point);
  setBcdToZero(this);
  readDoubleConversionToBcd(this,buffer,length,point);
  this->scale = this->scale + iVar1;
  this->explicitExactDouble = true;
  return;
}

Assistant:

void DecimalQuantity::convertToAccurateDouble() {
    U_ASSERT(origDouble != 0);
    int32_t delta = origDelta;

    // Call the slow oracle function (Double.toString in Java, DoubleToAscii in C++).
    char buffer[DoubleToStringConverter::kBase10MaximalLength + 1];
    bool sign; // unused; always positive
    int32_t length;
    int32_t point;
    DoubleToStringConverter::DoubleToAscii(
        origDouble,
        DoubleToStringConverter::DtoaMode::SHORTEST,
        0,
        buffer,
        sizeof(buffer),
        &sign,
        &length,
        &point
    );

    setBcdToZero();
    readDoubleConversionToBcd(buffer, length, point);
    scale += delta;
    explicitExactDouble = true;
}